

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessVertexArraysTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::VertexArrays::EnableDisableAttributesTest::DrawAndCheck
          (EnableDisableAttributesTest *this,bool bind_even_or_odd)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  int *piVar5;
  GLuint local_5c;
  int local_44;
  int local_40;
  GLint i_1;
  GLint reference_sum_1;
  GLint i;
  GLint reference_sum;
  GLint result;
  GLint *result_ptr;
  Functions *gl;
  bool bind_even_or_odd_local;
  EnableDisableAttributesTest *this_local;
  long lVar4;
  
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  if (bind_even_or_odd) {
    local_5c = this->m_po_odd;
  }
  else {
    local_5c = this->m_po_even;
  }
  (**(code **)(lVar4 + 0x1680))(local_5c);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glUseProgram call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x22a);
  (**(code **)(lVar4 + 0xd8))(this->m_vao);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glBindVertexArray call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x22d);
  (**(code **)(lVar4 + 0x30))(0);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glBeginTransformFeedback call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x230);
  (**(code **)(lVar4 + 0x538))(0,0,1);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glDrawArrays call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x234);
  (**(code **)(lVar4 + 0x638))();
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glEndTransformFeedback call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x238);
  piVar5 = (int *)(**(code **)(lVar4 + 0xcf8))(0x8c8e,35000);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glMapBuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x23c);
  iVar1 = *piVar5;
  (**(code **)(lVar4 + 0x1670))(0x8c8e);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glUnmapBuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x241);
  if (bind_even_or_odd) {
    reference_sum_1 = 0;
    for (i_1 = 1; i_1 < this->m_max_attributes; i_1 = i_1 + 2) {
      reference_sum_1 = i_1 + reference_sum_1;
    }
    if (reference_sum_1 == iVar1) {
      return true;
    }
  }
  else {
    local_40 = 0;
    for (local_44 = 0; local_44 < this->m_max_attributes; local_44 = local_44 + 2) {
      local_40 = local_44 + local_40;
    }
    if (local_40 == iVar1) {
      return true;
    }
  }
  return false;
}

Assistant:

bool EnableDisableAttributesTest::DrawAndCheck(bool bind_even_or_odd)
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Setup state. */
	gl.useProgram(bind_even_or_odd ? m_po_odd : m_po_even);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram call failed.");

	gl.bindVertexArray(m_vao);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray call failed.");

	gl.beginTransformFeedback(GL_POINTS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback call failed.");

	/* Draw. */
	gl.drawArrays(GL_POINTS, 0, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays call failed.");

	/* State reset. */
	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback call failed.");

	/* Result query. */
	glw::GLint* result_ptr = (glw::GLint*)gl.mapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, GL_READ_ONLY);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBuffer call failed.");

	glw::GLint result = *result_ptr;

	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer call failed.");

	/* Check result and return. */
	if (bind_even_or_odd)
	{
		glw::GLint reference_sum = 0;

		for (glw::GLint i = 1; i < m_max_attributes; i += 2)
		{
			reference_sum += i;
		}

		if (reference_sum == result)
		{
			return true;
		}
	}
	else
	{
		glw::GLint reference_sum = 0;

		for (glw::GLint i = 0; i < m_max_attributes; i += 2)
		{
			reference_sum += i;
		}

		if (reference_sum == result)
		{
			return true;
		}
	}

	return false;
}